

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O3

QSize __thiscall
QPixmapStyle::comboBoxSizeFromContents
          (QPixmapStyle *this,QStyleOption *option,QSize *contentsSize,QWidget *widget)

{
  QSize QVar1;
  ulong uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  ControlDescriptor local_74;
  QPixmapStyleDescriptor local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_74 = DD_ButtonEnabled;
  QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
            (&local_70,
             (QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)
             (*(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8 + 0xe8),&local_74);
  QVar1 = QCommonStyle::sizeFromContents
                    (&this->super_QCommonStyle,CT_ComboBox,option,contentsSize,widget);
  if (&(local_70.fileName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_70.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_70.fileName.d.d)->super_QArrayData,2,0x10);
    }
  }
  uVar3 = (ulong)(uint)local_70.size.ht.m_i;
  if (local_70.size.ht.m_i <= QVar1.ht.m_i.m_i) {
    uVar3 = (ulong)QVar1 >> 0x20;
  }
  if (local_70.tileRules.vertical == RepeatTile) {
    uVar3 = (ulong)(uint)QVar1.ht.m_i.m_i;
  }
  uVar2 = (ulong)(uint)local_70.size.wd.m_i;
  if (local_70.size.wd.m_i <= QVar1.wd.m_i.m_i) {
    uVar2 = (ulong)QVar1 & 0xffffffff;
  }
  if (local_70.tileRules.horizontal == RepeatTile) {
    uVar2 = (ulong)QVar1 & 0xffffffff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSize)(uVar2 | uVar3 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QPixmapStyle::comboBoxSizeFromContents(const QStyleOption *option,
                                             const QSize &contentsSize,
                                             const QWidget *widget) const
{
    Q_D(const QPixmapStyle);

    const QPixmapStyleDescriptor &desc = d->descriptors.value(DD_ButtonEnabled);

    QSize result = QCommonStyle::sizeFromContents(CT_ComboBox, option, contentsSize, widget);
    return d->computeSize(desc, result.width(), result.height());
}